

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  byte bVar4;
  ServerService service;
  sockaddr_in peerAddr;
  char msg [100];
  ServerService local_a0;
  sockaddr_in local_88;
  char local_78 [96];
  undefined4 local_18;
  
  bVar4 = 0;
  ServerService::ServerService(&local_a0,0x1ed8,0x14);
  pcVar2 = "BROADCAST FROM SERVER";
  pcVar3 = local_78;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pcVar3 = *(undefined8 *)pcVar2;
    pcVar2 = pcVar2 + ((ulong)bVar4 * -2 + 1) * 8;
    pcVar3 = pcVar3 + ((ulong)bVar4 * -2 + 1) * 8;
  }
  local_18 = 0;
  local_88 = ServerService::initBroadcast(&local_a0,0x2329);
  ServerService::startBroadcast(&local_a0,&local_88,local_78,5);
  ServerService::startBroadcast(&local_a0,&local_88,local_78,4);
  ServerService::startBroadcast(&local_a0,&local_88,local_78,3);
  ServerService::startBroadcast(&local_a0,&local_88,local_78,2);
  ServerService::startBroadcast(&local_a0,&local_88,local_78,1);
  ServerService::startBroadcast(&local_a0,&local_88,local_78,1);
  ServerService::startService(&local_a0);
  ServerService::~ServerService(&local_a0);
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) {
    int port = 7896;
    int size = 20;
//    cout << "Please input port and window size:";
//    cin >> port >> size;
    ServerService service = ServerService(port, size);

    char msg[100] = "BROADCAST FROM SERVER";
    //初始化广播
    struct sockaddr_in peerAddr = service.initBroadcast(9001);
    //发送单条广播
    service.startBroadcast(&peerAddr, msg, 5);
    service.startBroadcast(&peerAddr, msg, 4);
    service.startBroadcast(&peerAddr, msg, 3);
    service.startBroadcast(&peerAddr, msg, 2);
    service.startBroadcast(&peerAddr, msg);
    service.startBroadcast(&peerAddr, msg);
    service.startService();
//    service.startControlService();
//    service.startControlServiceWithResult();
    return 0;
}